

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O1

ll_node * wal_read(sptr_t data,sptr_t palette)

{
  uint uVar1;
  int32_t iVar2;
  undefined4 uVar3;
  wal_dk_header *out;
  void *pvVar4;
  ll_node *plVar5;
  size_t sVar6;
  ll_node *plVar7;
  long lVar8;
  uchar *puVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  undefined4 uVar13;
  uchar *buffer;
  uint uVar14;
  undefined4 uVar15;
  uint uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  sptr_t sVar21;
  size_t local_308 [4];
  undefined1 local_2e8 [12];
  undefined4 local_2dc [3];
  undefined8 local_2d0 [2];
  undefined8 local_2c0 [82];
  
  sVar11 = palette.size;
  puVar9 = palette.ptr;
  buffer = data.ptr;
  if (data.size < 0x37c || buffer == (uchar *)0x0) {
    return (ll_node *)0x0;
  }
  iVar2 = wal_get_type(buffer);
  if (iVar2 == 2) {
    out = (wal_dk_header *)xmalloc(0x37c);
    wal_dk_read_header(buffer,out);
    if (puVar9 == (uchar *)0x0) {
      sVar11 = 0x300;
      puVar9 = out->palette;
    }
    plVar7 = (ll_node *)(ulong)(out->height * out->width);
    lVar19 = 0;
    uVar18 = 1;
    do {
      sVar21 = sptr_slice(data,(ulong)out->offsets[lVar19],(size_t)plVar7);
      sVar10 = sVar21.size;
      if (sVar21.ptr == (uchar *)0x0) {
        iVar12 = 5;
        plVar5 = (ll_node *)0x0;
      }
      else {
        pvVar4 = xmalloc(sVar10);
        memcpy(pvVar4,sVar21.ptr,sVar10);
        iVar12 = 0;
        uVar15 = 0;
        if (sVar10 != 0) {
          sVar6 = 0;
          do {
            if (*(char *)((long)pvVar4 + sVar6) == -1) {
              uVar15 = 1;
              goto LAB_00103c79;
            }
            sVar6 = sVar6 + 1;
          } while (sVar10 != sVar6);
          uVar15 = 0;
        }
LAB_00103c79:
        uVar13 = (undefined4)(out->width / uVar18);
        uVar16 = (uint)uVar18;
        if (out->width < uVar16) {
          uVar13 = 1;
        }
        uVar3 = (undefined4)(out->height / uVar18);
        if (out->height < uVar16) {
          uVar3 = 1;
        }
        lVar8 = lVar19 * 0x50;
        local_308[lVar19 * 10] = (size_t)pvVar4;
        local_308[lVar19 * 10 + 1] = sVar10;
        local_308[lVar19 * 10 + 2] = (size_t)puVar9;
        *(size_t *)(local_2e8 + lVar8 + -8) = sVar11;
        local_2e8[lVar8] = 1;
        local_2e8[lVar8 + 8] = 2;
        local_2dc[lVar19 * 0x14] = uVar13;
        local_2dc[lVar19 * 0x14 + 1] = uVar3;
        local_2d0[lVar19 * 10] = out;
        local_2c0[lVar19 * 10 + -1] = 0;
        *(undefined4 *)(local_2c0 + lVar19 * 10) = uVar15;
        plVar5 = (ll_node *)((ulong)plVar7 >> 2);
        if (plVar7 < (ll_node *)0x4) {
          plVar5 = (ll_node *)0x1;
        }
        uVar18 = (ulong)(uVar16 * 2);
        plVar7 = plVar5;
      }
      if (iVar12 != 0) {
        if (iVar12 != 5) {
          return plVar5;
        }
        goto LAB_00103d4e;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 9);
    sVar11 = 9;
  }
  else {
    if (iVar2 != 1) {
      return (ll_node *)0x0;
    }
    out = (wal_dk_header *)xmalloc(100);
    wal_q2_read_header(buffer,(wal_q2_header *)out);
    plVar7 = (ll_node *)(ulong)(out->width * *(uint32_t *)(out->name + 0x1c));
    lVar19 = 10;
    puVar17 = local_2c0;
    do {
      sVar21 = sptr_slice(data,(ulong)*(uint *)(out->padding + lVar19 * 4 + -1),(size_t)plVar7);
      sVar10 = sVar21.size;
      if (sVar21.ptr == (uchar *)0x0) {
        iVar12 = 5;
        plVar5 = (ll_node *)0x0;
      }
      else {
        pvVar4 = xmalloc(sVar10);
        memcpy(pvVar4,sVar21.ptr,sVar10);
        uVar14 = (int)lVar19 - 9;
        uVar16 = *(uint *)(out->name + 0x1c);
        uVar1 = out->width;
        iVar12 = 0;
        puVar17[-9] = pvVar4;
        puVar17[-8] = sVar10;
        puVar17[-7] = puVar9;
        puVar17[-6] = sVar11;
        *(undefined1 *)(puVar17 + -5) = 1;
        *(undefined1 *)(puVar17 + -4) = 1;
        *(uint *)((long)puVar17 + -0x1c) = uVar16 / uVar14;
        *(uint *)(puVar17 + -3) = uVar1 / uVar14;
        puVar17[-2] = out;
        puVar17[-1] = 0;
        *(undefined4 *)puVar17 = 0;
        plVar5 = (ll_node *)((ulong)plVar7 >> 2);
        bVar20 = plVar7 < (ll_node *)0x4;
        plVar7 = plVar5;
        if (bVar20) {
          plVar5 = (ll_node *)0x1;
          plVar7 = plVar5;
        }
      }
      if (iVar12 != 0) {
        if (iVar12 != 5) {
          return plVar5;
        }
LAB_00103d4e:
        free(out);
        return (ll_node *)0x0;
      }
      lVar19 = lVar19 + 1;
      puVar17 = puVar17 + 10;
    } while (lVar19 != 0xe);
    sVar11 = 4;
  }
  plVar7 = ll_from_array(local_308,0x50,sVar11);
  return plVar7;
}

Assistant:

struct ll_node *wal_read(const sptr_t data, const sptr_t palette)
{
	if (SPTR_IS_NULL(data)) {
		return NULL;
	}
	/* Daikatana header is bigger */
	if (data.size < WAL_DK_HEADER_SIZE) {
		return NULL;
	}
	switch (wal_get_type(data.ptr)) {
		case WAL_TYPE_QUAKE2:
			return wal_q2_read(data, palette);
		case WAL_TYPE_DAIKATANA:
			return wal_dk_read(data, palette);
		default:
			return NULL;
	}
}